

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O2

char * TiXmlBase::ReadName(char *p,TiXmlString *name,TiXmlEncoding encoding)

{
  long lVar1;
  int iVar2;
  byte anyByte;
  char *pcVar3;
  size_type len;
  
  pcVar3 = "";
  TiXmlString::operator=(name,"");
  if (p == (char *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxmlparser.cpp"
                  ,0x197,
                  "static const char *TiXmlBase::ReadName(const char *, TiXmlString *, TiXmlEncoding)"
                 );
  }
  anyByte = *p;
  if ((anyByte == 0) ||
     ((iVar2 = IsAlpha(anyByte,(TiXmlEncoding)pcVar3), anyByte != 0x5f && (iVar2 == 0)))) {
    return (char *)0x0;
  }
  len = 0;
  while (anyByte != 0) {
    iVar2 = IsAlphaNum(anyByte,(TiXmlEncoding)pcVar3);
    if ((iVar2 == 0) &&
       ((0x32 < anyByte - 0x2d || ((0x4000000002003U >> ((ulong)(anyByte - 0x2d) & 0x3f) & 1) == 0))
       )) break;
    lVar1 = len + 1;
    len = len + 1;
    anyByte = p[lVar1];
  }
  if ((long)len < 1) {
    return p + len;
  }
  TiXmlString::assign(name,p,len);
  return p + len;
}

Assistant:

const char* TiXmlBase::ReadName( const char* p, TIXML_STRING * name, TiXmlEncoding encoding )
{
	// Oddly, not supported on some comilers,
	//name->clear();
	// So use this:
	*name = "";
	assert( p );

	// Names start with letters or underscores.
	// Of course, in unicode, tinyxml has no idea what a letter *is*. The
	// algorithm is generous.
	//
	// After that, they can be letters, underscores, numbers,
	// hyphens, or colons. (Colons are valid ony for namespaces,
	// but tinyxml can't tell namespaces from names.)
	if (    p && *p 
		 && ( IsAlpha( (unsigned char) *p, encoding ) || *p == '_' ) )
	{
		const char* start = p;
		while(		p && *p
				&&	(		IsAlphaNum( (unsigned char ) *p, encoding ) 
						 || *p == '_'
						 || *p == '-'
						 || *p == '.'
						 || *p == ':' ) )
		{
			//(*name) += *p; // expensive
			++p;
		}
		if ( p-start > 0 ) {
			name->assign( start, p-start );
		}
		return p;
	}
	return 0;
}